

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O1

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>,-1,-1,false>>::
applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>const,_1,1,false>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>> *this,
          Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false> *essential,Scalar *tau,
          Scalar *workspace)

{
  float fVar1;
  XprTypeNested pMVar2;
  SrcEvaluatorType *pSVar3;
  float *pfVar4;
  long lVar5;
  char *pcVar6;
  XprTypeNested *pXVar7;
  XprTypeNested pMVar8;
  variable_if_dynamic<long,__1> *pvVar9;
  float *pfVar10;
  ActualDstType actualDst;
  Index col;
  XprTypeNested pMVar11;
  CoeffReturnType CVar12;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  mul_assign_op<float,_float> local_181;
  float *local_180;
  SrcEvaluatorType local_178;
  Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false> local_170
  ;
  undefined1 local_108 [20];
  float fStack_f4;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>> *pMStack_f0;
  variable_if_dynamic<long,__1> local_e8;
  variable_if_dynamic<long,__1> vStack_e0;
  XprTypeNested local_d8;
  variable_if_dynamic<long,__1> local_d0;
  variable_if_dynamic<long,__1> vStack_c8;
  variable_if_dynamic<long,__1> local_c0;
  variable_if_dynamic<long,__1> local_b8 [10];
  DstEvaluatorType *local_68;
  variable_if_dynamic<long,__1> local_58;
  PointerType local_50;
  variable_if_dynamic<long,__1> local_40;
  SrcEvaluatorType *local_38;
  
  lVar5 = *(long *)(this + 8);
  if (lVar5 == 1) {
    if (*(long *)(this + 0x10) < 0) {
      pcVar6 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1, 0, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1, 0, -1, 1>]"
      ;
LAB_00156659:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,pcVar6);
    }
    local_178.m_functor.m_other = 1.0 - *tau;
    local_108._8_8_ = &local_178;
    local_170.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_data = *(PointerType *)this;
    local_108._0_8_ = &local_170;
    local_170.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_cols.m_value = *(long *)(*(long *)(this + 0x18) + 8);
    unique0x00004e80 = &local_181;
    pMStack_f0 = this;
    internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>
           *)local_108);
  }
  else if ((*tau != 0.0) || (NAN(*tau))) {
    pMVar2 = *(XprTypeNested *)(this + 0x10);
    if ((long)pMVar2 < 0) {
      __assert_fail("vecSize >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                    ,0xa6,
                    "Eigen::MapBase<Eigen::Map<Eigen::Matrix<float, 1, -1, 1, 1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<float, 1, -1, 1, 1, 1>>, Level = 0]"
                   );
    }
    local_170.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_rows.m_value = lVar5 - 1;
    local_170.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_data = (PointerType)(*(long *)this + 4);
    local_170.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_cols.m_value = (long)pMVar2;
    if ((long)((ulong)pMVar2 |
              local_170.
              super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
              .m_rows.m_value) < 0 && *(long *)this != 0) {
      pcVar6 = 
      "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 1>>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 1>>>, Level = 0]"
      ;
    }
    else {
      local_170.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>.m_cols.
      m_value = *(long *)(this + 0x10);
      local_170.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.m_xpr =
           *(XprTypeNested *)(this + 0x18);
      local_170.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      m_outerStride = *(Index *)(this + 0x30);
      local_170.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.m_startRow.
      m_value = *(long *)(this + 0x20);
      local_170.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.m_startCol.
      m_value = *(long *)(this + 0x28);
      local_170.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>.m_data =
           *(PointerType *)this;
      local_170.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>.m_rows.
      m_value = *(long *)(this + 8);
      local_170.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_startRow.m_value = 1;
      local_170.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_startCol.m_value = 0;
      local_170.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_outerStride =
           ((*(XprTypeNested *)(this + 0x18))->
           super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if (lVar5 < 1) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                      ,0x93,
                      "Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<float, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      local_108._8_8_ =
           (essential->
           super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>)
           .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>
           .m_rows.m_value;
      local_180 = tau;
      if (local_108._8_8_ !=
          local_170.
          super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_rows.m_value) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Product.h"
                      ,0x62,
                      "Eigen::Product<Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<float, -1, 8>, -1, 1>>, Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 1>>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<float, -1, 8>, -1, 1>>, Rhs = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 1>>>, Option = 0]"
                     );
      }
      local_108._0_8_ =
           (essential->
           super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>)
           .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>
           .m_data;
      pMStack_f0 = (MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>> *)
                   (essential->
                   super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
                   ).
                   super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>
                   .m_xpr;
      stack0xffffffffffffff08 =
           *(mul_assign_op<float,_float> **)
            &(essential->
             super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
             ).
             super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
             super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>
             .field_0x10;
      local_e8.m_value =
           (essential->
           super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>)
           .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
           m_startRow.m_value;
      vStack_e0.m_value =
           (essential->
           super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>)
           .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
           m_startCol.m_value;
      local_d8 = (XprTypeNested)
                 (essential->
                 super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>
                 .m_outerStride;
      local_d0.m_value =
           (long)local_170.
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
                 .m_data;
      vStack_c8.m_value =
           local_170.
           super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
           .m_rows.m_value;
      local_c0.m_value = (long)pMVar2;
      pXVar7 = &local_170.
                super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
                .m_xpr;
      pvVar9 = local_b8;
      for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
        pvVar9->m_value =
             (long)(pXVar7->
                   super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>
                   ).
                   super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>
                   .m_data;
        pXVar7 = (XprTypeNested *)
                 &(pXVar7->
                  super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>
                  ).
                  super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>
                  .m_rows;
        pvVar9 = pvVar9 + 1;
      }
      local_58.m_value =
           (((DstXprType *)pMStack_f0)->
           super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>.
           m_rows.m_value;
      local_40.m_value = *(Index *)(local_b8[3].m_value + 8);
      local_68 = (DstEvaluatorType *)local_108._0_8_;
      local_50 = local_170.
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
                 .m_data;
      local_38 = (SrcEvaluatorType *)local_108._8_8_;
      if (pMVar2 != (XprTypeNested)0x0) {
        pMVar11 = (XprTypeNested)0x0;
        do {
          CVar12 = internal::
                   product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
                   ::coeff((product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
                            *)local_108,0,(Index)pMVar11);
          workspace[(long)pMVar11] = CVar12;
          pMVar11 = (XprTypeNested)
                    ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>)
                            .m_storage.m_data + 1);
        } while (pMVar2 != pMVar11);
      }
      pfVar4 = *(float **)this;
      pMVar11 = *(XprTypeNested *)(this + 0x10);
      if (-1 < (long)pMVar11 || pfVar4 == (float *)0x0) {
        if (0 < *(long *)(this + 8)) {
          if (pMVar2 != pMVar11) {
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                          ,0x2f2,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, 1, -1, 1, 1, 1>>, SrcXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 1>>, 1>, Functor = Eigen::internal::add_assign_op<float, float>]"
                         );
          }
          if (pMVar2 != (XprTypeNested)0x0) {
            lVar5 = *(long *)(*(long *)(this + 0x18) + 8);
            pMVar8 = (XprTypeNested)0x0;
            pfVar10 = pfVar4;
            do {
              workspace[(long)pMVar8] = *pfVar10 + workspace[(long)pMVar8];
              pMVar8 = (XprTypeNested)
                       ((long)&(pMVar8->
                               super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data + 1);
              pfVar10 = pfVar10 + lVar5;
            } while (pMVar2 != pMVar8);
          }
          if (0 < *(long *)(this + 8)) {
            if (0 < (long)pMVar11) {
              fVar1 = *local_180;
              lVar5 = *(long *)(*(long *)(this + 0x18) + 8);
              pMVar8 = (XprTypeNested)0x0;
              do {
                *pfVar4 = *pfVar4 - workspace[(long)pMVar8] * fVar1;
                pMVar8 = (XprTypeNested)
                         ((long)&(pMVar8->
                                 super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                                 m_storage.m_data + 1);
                pfVar4 = pfVar4 + lVar5;
              } while (pMVar11 != pMVar8);
            }
            pSVar3 = (SrcEvaluatorType *)
                     (essential->
                     super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
                     ).
                     super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>
                     .m_rows.m_value;
            if (-1 < (long)pSVar3) {
              local_c0.m_value =
                   (essential->
                   super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
                   ).
                   super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>
                   .m_outerStride;
              pMStack_f0 = (MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>> *
                           )(essential->
                            super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
                            ).
                            super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>
                            .
                            super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>
                            .m_data;
              local_e8.m_value =
                   (essential->
                   super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
                   ).
                   super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>
                   .m_rows.m_value;
              vStack_e0.m_value =
                   *(long *)&(essential->
                             super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
                             ).
                             super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>
                             .
                             super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>
                             .field_0x10;
              local_d8 = (essential->
                         super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
                         ).
                         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>
                         .m_xpr;
              local_d0.m_value =
                   (essential->
                   super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
                   ).
                   super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>
                   .m_startRow.m_value;
              vStack_c8.m_value =
                   (essential->
                   super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
                   ).
                   super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>
                   .m_startCol.m_value;
              stack0xffffffffffffff08 =
                   (mul_assign_op<float,_float> *)CONCAT44(*local_180,local_108._16_4_);
              local_108._8_8_ = pSVar3;
              local_b8[1].m_value = (long)workspace;
              local_b8[3].m_value = (long)pMVar2;
              internal::
              Assignment<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::internal::sub_assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
              ::run(&local_170,(SrcXprType *)local_108,(sub_assign_op<float,_float> *)&local_178);
              return;
            }
            pcVar6 = 
            "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = const Eigen::Matrix<float, -1, 1>]"
            ;
            goto LAB_00156659;
          }
        }
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 1>>, 1>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Matrix<float, -1, 1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      pcVar6 = 
      "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 1>>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 1>>, 1>, Level = 0]"
      ;
    }
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,pcVar6);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void MatrixBase<Derived>::applyHouseholderOnTheLeft(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(rows() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else if(tau!=Scalar(0))
  {
    Map<typename internal::plain_row_type<PlainObject>::type> tmp(workspace,cols());
    Block<Derived, EssentialPart::SizeAtCompileTime, Derived::ColsAtCompileTime> bottom(derived(), 1, 0, rows()-1, cols());
    tmp.noalias() = essential.adjoint() * bottom;
    tmp += this->row(0);
    this->row(0) -= tau * tmp;
    bottom.noalias() -= tau * essential * tmp;
  }
}